

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType BVar1;
  RefNull *this_00;
  HeapType heapType;
  HeapType local_28;
  HeapType type_local;
  
  local_28.id = type.id;
  this_00 = (RefNull *)MixedArena::allocSpace(&this->wasm->allocator,0x10,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression._id = RefNullId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id = 0;
  BVar1 = HeapType::getBottom(&local_28);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  wasm::Type::Type((Type *)&type_local,heapType,Nullable);
  RefNull::finalize(this_00,(Type)type_local.id);
  return this_00;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }